

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  cmLocalGenerator *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  pointer ppcVar5;
  pointer config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string local_228;
  string firstConfigFiles;
  string thisConfigFiles;
  string local_1c8;
  ostringstream e;
  
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_1c8,this->Makefile,&configs,true);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&e,"",(allocator *)&firstConfigFiles);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  pbVar1 = configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  GetSourceFiles(this,files,
                 configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  config = pbVar1;
  while( true ) {
    pbVar2 = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (config == configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003368cc;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                        &configFiles.
                         super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,config)
    ;
    bVar3 = std::operator!=((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                            &configFiles.
                             super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,
                            files);
    if (bVar3) break;
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
    config = config + 1;
  }
  firstConfigFiles._M_string_length = 0;
  firstConfigFiles.field_2._M_local_buf[0] = '\0';
  firstConfigFiles._M_dataplus._M_p = (pointer)&firstConfigFiles.field_2;
  for (ppcVar5 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 !=
      (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    std::__cxx11::string::append((char *)&firstConfigFiles);
    cmSourceFile::GetFullPath(*ppcVar5,(string *)0x0);
    std::__cxx11::string::append((string *)&firstConfigFiles);
  }
  thisConfigFiles._M_dataplus._M_p = (pointer)&thisConfigFiles.field_2;
  thisConfigFiles._M_string_length = 0;
  thisConfigFiles.field_2._M_local_buf[0] = '\0';
  for (ppcVar5 = configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar5 !=
      configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    std::__cxx11::string::append((char *)&thisConfigFiles);
    cmSourceFile::GetFullPath(*ppcVar5,(string *)0x0);
    std::__cxx11::string::append((string *)&thisConfigFiles);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar4 = std::operator<<((ostream *)&e,"Target \"");
  poVar4 = std::operator<<(poVar4,(string *)&this->Target->Name);
  poVar4 = std::operator<<(poVar4,
                           "\" has source files which vary by configuration. This is not supported by the \""
                          );
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_228);
  poVar4 = std::operator<<(poVar4,(string *)&local_228);
  poVar4 = std::operator<<(poVar4,"\" generator.\nConfig \"");
  poVar4 = std::operator<<(poVar4,(string *)pbVar1);
  poVar4 = std::operator<<(poVar4,"\":\n  ");
  poVar4 = std::operator<<(poVar4,(string *)&firstConfigFiles);
  poVar4 = std::operator<<(poVar4,"\nConfig \"");
  poVar4 = std::operator<<(poVar4,(string *)config);
  poVar4 = std::operator<<(poVar4,"\":\n  ");
  poVar4 = std::operator<<(poVar4,(string *)&thisConfigFiles);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&local_228);
  this_00 = this->LocalGenerator;
  std::__cxx11::stringbuf::str();
  cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  std::__cxx11::string::~string((string *)&thisConfigFiles);
  std::__cxx11::string::~string((string *)&firstConfigFiles);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&configFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
LAB_003368cc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  return config == pbVar2;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFiles(
    std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> configs;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty())
    {
    configs.push_back("");
    }

  std::vector<std::string>::const_iterator it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFiles(files, firstConfig);

  for ( ; it != configs.end(); ++it)
    {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFiles(configFiles, *it);
    if (configFiles != files)
      {
      std::string firstConfigFiles;
      const char* sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = files.begin();
           fi != files.end(); ++fi)
        {
        firstConfigFiles += sep;
        firstConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
        }

      std::string thisConfigFiles;
      sep = "";
      for (std::vector<cmSourceFile*>::const_iterator fi = configFiles.begin();
           fi != configFiles.end(); ++fi)
        {
        thisConfigFiles += sep;
        thisConfigFiles += (*fi)->GetFullPath();
        sep = "\n  ";
        }
      std::ostringstream e;
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      this->LocalGenerator->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }
  return true;
}